

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Attr_Decl_AST_Node::eval_internal(Attr_Decl_AST_Node *this,Dispatch_State *t_ss)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  long lVar4;
  Dispatch_Engine *this_00;
  const_iterator cVar5;
  element_type *peVar6;
  Type_Conversions_State *in_RCX;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *name;
  Boxed_Value BVar7;
  string attr_name;
  string class_name;
  bool local_10a;
  undefined1 local_109;
  long *local_108;
  long local_100;
  long local_f8 [2];
  key_type local_e8;
  anon_class_32_1_15d86eb9_for_m_f local_c8;
  Dynamic_Object_Function *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  Proxy_Function local_98 [2];
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  local_60;
  
  chaiscript::detail::Dispatch_Engine::get_parent_locals_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
              *)&local_60,(Dispatch_Engine *)*in_RDX);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"_current_class_name","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          ::find(&local_60,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar5._M_node == p_Var2) {
    lVar3 = ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.__align;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    lVar4 = *(long *)(lVar3 + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,lVar4,*(long *)(lVar3 + 0x28) + lVar4);
  }
  else {
    boxed_cast<std::__cxx11::string>
              (&local_e8,(chaiscript *)(cVar5._M_node + 2),(Boxed_Value *)0x0,in_RCX);
  }
  lVar3 = *(long *)((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base.
                           _M_mutex + (ulong)((_Rb_tree_header *)cVar5._M_node == p_Var2) * 0x10);
  local_108 = local_f8;
  lVar4 = *(long *)(lVar3 + 0x20);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,lVar4,*(long *)(lVar3 + 0x28) + lVar4);
  this_00 = (Dispatch_Engine *)*in_RDX;
  paVar1 = &local_c8.attr_name.field_2;
  local_c8.attr_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,local_108,local_100 + (long)local_108);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Value(chaiscript::dispatch::Dynamic_Object&),chaiscript::eval::Attr_Decl_AST_Node::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::dispatch::Dynamic_Object&)_1_>,chaiscript::eval::Attr_Decl_AST_Node::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::dispatch::Dynamic_Object&)_1_const&>
            ((chaiscript *)&local_70,&local_c8);
  local_10a = true;
  local_a8 = (Dynamic_Object_Function *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::detail::Dynamic_Object_Function,std::allocator<chaiscript::dispatch::detail::Dynamic_Object_Function>,std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,bool>
            (&_Stack_a0,&local_a8,
             (allocator<chaiscript::dispatch::detail::Dynamic_Object_Function> *)&local_109,
             &local_e8,&local_70,&local_10a);
  local_98[0].
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_a8->super_Proxy_Function_Base;
  local_98[0].
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a0._M_pi;
  local_a8 = (Dynamic_Object_Function *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  name = (string *)
         (*(long *)((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base.
                           _M_mutex + (ulong)((_Rb_tree_header *)cVar5._M_node == p_Var2) * 0x10) +
         0x20);
  chaiscript::detail::Dispatch_Engine::validate_object_name(this_00,name);
  chaiscript::detail::Dispatch_Engine::add_function(this_00,local_98,name);
  if (local_98[0].
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98[0].
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  if (local_70.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.attr_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.attr_name._M_dataplus._M_p,
                    local_c8.attr_name.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  (this->super_AST_Node)._vptr_AST_Node = (_func_int **)0x0;
  peVar6 = (element_type *)operator_new(0x50);
  (peVar6->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar6->_vptr_AST_Node = (_func_int **)&PTR___Sp_counted_ptr_inplace_003110a8;
  (peVar6->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&peVar6->identifier = 0;
  *(undefined4 *)&(peVar6->text)._M_dataplus._M_p = 0x20;
  (peVar6->text)._M_string_length = 0;
  (peVar6->text).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(peVar6->text).field_2 + 8) = 0;
  (peVar6->location).start.line = 0;
  (peVar6->location).start.column = 0;
  *(undefined2 *)&(peVar6->location).end.line = 0;
  (this->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  (this->super_AST_Node)._vptr_AST_Node =
       (_func_int **)
       &(peVar6->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
        super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&local_60);
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE 
        {
          const auto &d = t_ss->get_parent_locals();
          const auto itr = d.find("_current_class_name");
          const auto class_offset = (itr != d.end())?-1:0;
          std::string class_name = (itr != d.end())?std::string(boxed_cast<std::string>(itr->second)):this->children[0]->text;

          try {
            std::string attr_name = this->children[static_cast<size_t>(1 + class_offset)]->text;

            t_ss->add(
                std::make_shared<dispatch::detail::Dynamic_Object_Function>(
                     std::move(class_name),
                     fun([attr_name](dispatch::Dynamic_Object &t_obj) {
                           return t_obj.get_attr(attr_name);
                         }),
                     true

                ), this->children[static_cast<size_t>(1 + class_offset)]->text);

          }
          catch (const exception::reserved_word_error &) {
            throw exception::eval_error("Reserved word used as attribute '" + this->children[static_cast<size_t>(1 + class_offset)]->text + "'");
          } catch (const exception::name_conflict_error &e) {
            throw exception::eval_error("Attribute redefined '" + e.name() + "'");
          }
          return Boxed_Value();
        }